

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

void __thiscall tonk::SessionOutgoing::Shutdown(SessionOutgoing *this)

{
  ostringstream *poVar1;
  Channel *pCVar2;
  SiameseResult SVar3;
  int iVar4;
  OutputWorker *pOVar5;
  uint64_t stats [9];
  uint64_t local_1f8 [9];
  undefined1 local_1b0 [392];
  
  SVar3 = siamese_encoder_stats(this->FECEncoder,local_1f8,9);
  pCVar2 = (this->Deps).Logger;
  if (SVar3 == Siamese_Success) {
    if (1 < (int)pCVar2->ChannelMinLevel) goto LAB_0014ad52;
    local_1b0._0_8_ = pCVar2->ChannelName;
    poVar1 = (ostringstream *)(local_1b0 + 0x10);
    local_1b0._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(pCVar2->Prefix)._M_dataplus._M_p,(pCVar2->Prefix)._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Siamese encoder stats: Memory used = ",0x25);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," KB, Originals sent = ",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", Recoveries sent = ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_1b0);
  }
  else {
    if (4 < (int)pCVar2->ChannelMinLevel) goto LAB_0014ad52;
    local_1b0._0_8_ = pCVar2->ChannelName;
    poVar1 = (ostringstream *)(local_1b0 + 0x10);
    local_1b0._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(pCVar2->Prefix)._M_dataplus._M_p,(pCVar2->Prefix)._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Unable to retrieve siamese encoder stats",0x28);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 0x10));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
LAB_0014ad52:
  pCVar2 = (this->Deps).Logger;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->super_OutgoingQueueCommon);
  if (iVar4 == 0) {
    pktalloc::Allocator::GetMemoryAllocatedBytes
              (&(this->super_OutgoingQueueCommon).WriteAllocator.Allocator);
    pthread_mutex_unlock((pthread_mutex_t *)&this->super_OutgoingQueueCommon);
    if ((int)pCVar2->ChannelMinLevel < 2) {
      local_1b0._0_8_ = pCVar2->ChannelName;
      poVar1 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._8_4_ = Debug;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(pCVar2->Prefix)._M_dataplus._M_p,
                 (pCVar2->Prefix)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Write allocator memory used: ",0x1d);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," KB",3);
      pOVar5 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    siamese_encoder_free(this->FECEncoder);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void SessionOutgoing::Shutdown()
{
    uint64_t stats[SiameseEncoderStats_Count];
    SiameseResult result = siamese_encoder_stats(FECEncoder, stats, SiameseEncoderStats_Count);
    if (result != Siamese_Success) {
        Deps.Logger->Error("Unable to retrieve siamese encoder stats");
    }
    else {
        Deps.Logger->Debug("Siamese encoder stats:" \
            " Memory used = ", stats[SiameseEncoderStats_MemoryUsed] / 1000, " KB" \
            ", Originals sent = ", stats[SiameseEncoderStats_OriginalCount],
            ", Recoveries sent = ", stats[SiameseEncoderStats_RecoveryCount]);
    }

    Deps.Logger->Debug("Write allocator memory used: ",
        WriteAllocator.GetUsedMemory() / 1000, " KB");

    siamese_encoder_free(FECEncoder);

    // Note: Allocations are freed automatically by FECEncoder object
}